

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

int __thiscall libtorrent::setting_by_name(libtorrent *this,string_view key)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  long lVar2;
  long lVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  libtorrent *local_a8;
  char *local_a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_98;
  libtorrent *local_88;
  char *local_80;
  int local_74;
  undefined1 auStack_70 [4];
  int k_2;
  libtorrent *local_60;
  char *local_58;
  int local_4c;
  undefined1 auStack_48 [4];
  int k_1;
  libtorrent *local_38;
  char *local_30;
  int local_24;
  libtorrent *plStack_20;
  int k;
  string_view key_local;
  
  key_local._M_len = key._M_len;
  local_24 = 0;
  plStack_20 = this;
  while( true ) {
    lVar2 = (long)local_24;
    lVar3 = aux::
            container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
            ::end_index((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                         *)(anonymous_namespace)::str_settings);
    if (lVar3 <= lVar2) {
      local_4c = 0;
      while( true ) {
        lVar2 = (long)local_4c;
        lVar3 = aux::
                container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                ::end_index((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                             *)(anonymous_namespace)::int_settings);
        if (lVar3 <= lVar2) {
          local_74 = 0;
          while( true ) {
            lVar2 = (long)local_74;
            lVar3 = aux::
                    container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                    ::end_index((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                                 *)(anonymous_namespace)::bool_settings);
            if (lVar3 <= lVar2) {
              local_a8 = plStack_20;
              local_a0 = (char *)key_local._M_len;
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_b8,"peer_tos");
              __x._M_str = local_a0;
              __x._M_len = (size_t)local_a8;
              bVar1 = ::std::operator==(__x,local_b8);
              if (bVar1) {
                key_local._M_str._4_4_ = 0x4028;
              }
              else {
                key_local._M_str._4_4_ = -1;
              }
              return key_local._M_str._4_4_;
            }
            local_88 = plStack_20;
            local_80 = (char *)key_local._M_len;
            pvVar6 = aux::
                     container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                     ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                                   *)(anonymous_namespace)::bool_settings,(long)local_74);
            ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_98,pvVar6->name);
            __x_00._M_str = local_80;
            __x_00._M_len = (size_t)local_88;
            bVar1 = ::std::operator!=(__x_00,local_98);
            if (!bVar1) break;
            local_74 = local_74 + 1;
          }
          return local_74 + 0x8000;
        }
        local_60 = plStack_20;
        local_58 = (char *)key_local._M_len;
        pvVar5 = aux::
                 container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                 ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                               *)(anonymous_namespace)::int_settings,(long)local_4c);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_70,pvVar5->name);
        __x_01._M_str = local_58;
        __x_01._M_len = (size_t)local_60;
        bVar1 = ::std::operator!=(__x_01,_auStack_70);
        if (!bVar1) break;
        local_4c = local_4c + 1;
      }
      return local_4c + 0x4000;
    }
    local_38 = plStack_20;
    local_30 = (char *)key_local._M_len;
    pvVar4 = aux::
             container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
             ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                           *)(anonymous_namespace)::str_settings,(long)local_24);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,pvVar4->name);
    __x_02._M_str = local_30;
    __x_02._M_len = (size_t)local_38;
    bVar1 = ::std::operator!=(__x_02,_auStack_48);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int setting_by_name(string_view const key)
	{
		for (int k = 0; k < str_settings.end_index(); ++k)
		{
			if (key != str_settings[k].name) continue;
			return settings_pack::string_type_base + k;
		}
		for (int k = 0; k < int_settings.end_index(); ++k)
		{
			if (key != int_settings[k].name) continue;
			return settings_pack::int_type_base + k;
		}
		for (int k = 0; k < bool_settings.end_index(); ++k)
		{
			if (key != bool_settings[k].name) continue;
			return settings_pack::bool_type_base + k;
		}

		// backwards compatibility with previous name
		if (key == "peer_tos")
			return settings_pack::peer_dscp;

		return -1;
	}